

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockets.h
# Opt level: O0

int open_nb_socket(char *addr,char *port)

{
  FILE *__stream;
  int __fd;
  uint uVar1;
  char *pcVar2;
  addrinfo *local_68;
  addrinfo *servinfo;
  addrinfo *p;
  int rv;
  int sockfd;
  addrinfo hints;
  char *port_local;
  char *addr_local;
  
  hints.ai_next = (addrinfo *)port;
  memset(&rv,0,0x30);
  sockfd = 0;
  hints.ai_flags = 1;
  p._4_4_ = -1;
  p._0_4_ = getaddrinfo(addr,(char *)hints.ai_next,(addrinfo *)&rv,&local_68);
  __stream = _stderr;
  if ((int)p == 0) {
    p._0_4_ = 0;
    for (servinfo = (addrinfo *)local_68; servinfo != (addrinfo *)0x0; servinfo = servinfo->ai_next)
    {
      p._4_4_ = socket(servinfo->ai_family,servinfo->ai_socktype,servinfo->ai_protocol);
      if (p._4_4_ != -1) {
        p._0_4_ = connect(p._4_4_,(sockaddr *)servinfo->ai_addr,servinfo->ai_addrlen);
        if ((int)p != -1) break;
        close(p._4_4_);
        p._4_4_ = -1;
      }
    }
    freeaddrinfo(local_68);
    __fd = p._4_4_;
    if (p._4_4_ != -1) {
      uVar1 = fcntl(p._4_4_,3);
      fcntl(__fd,4,(ulong)(uVar1 | 0x800));
    }
    addr_local._4_4_ = p._4_4_;
  }
  else {
    pcVar2 = gai_strerror((int)p);
    fprintf(__stream,"Failed to open socket (getaddrinfo): %s\n",pcVar2);
    addr_local._4_4_ = -1;
  }
  return addr_local._4_4_;
}

Assistant:

int open_nb_socket(const char* addr, const char* port) {
    struct addrinfo hints = {0};

    hints.ai_family = AF_UNSPEC; /* IPv4 or IPv6 */
    hints.ai_socktype = SOCK_STREAM; /* Must be TCP */
    int sockfd = -1;
    int rv;
    struct addrinfo *p, *servinfo;

    /* get address information */
    rv = getaddrinfo(addr, port, &hints, &servinfo);
    if(rv != 0) {
        fprintf(stderr, "Failed to open socket (getaddrinfo): %s\n", gai_strerror(rv));
        return -1;
    }

    /* open the first possible socket */
    for(p = servinfo; p != NULL; p = p->ai_next) {
        sockfd = socket(p->ai_family, p->ai_socktype, p->ai_protocol);
        if (sockfd == -1) continue;

        /* connect to server */
        rv = connect(sockfd, p->ai_addr, p->ai_addrlen);
        if(rv == -1) {
          close(sockfd);
          sockfd = -1;
          continue;
        }
        break;
    }  

    /* free servinfo */
    freeaddrinfo(servinfo);

    /* make non-blocking */
#if !defined(WIN32)
    if (sockfd != -1) fcntl(sockfd, F_SETFL, fcntl(sockfd, F_GETFL) | O_NONBLOCK);
#else
    if (sockfd != INVALID_SOCKET) {
        int iMode = 1;
        ioctlsocket(sockfd, FIONBIO, &iMode);
    }
#endif
#if defined(__VMS)
    /* 
        OpenVMS only partially implements fcntl. It works on file descriptors
        but silently fails on socket descriptors. So we need to fall back on
        to the older ioctl system to set non-blocking IO
    */
    int on = 1;                 
    if (sockfd != -1) ioctl(sockfd, FIONBIO, &on);
#endif

    /* return the new socket fd */
    return sockfd;
}